

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>>>>>
::find_or_prepare_insert_non_soo<std::__cxx11::string>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>>>>>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  char *pcVar1;
  size_t size;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ushort uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  bool bVar38;
  char cVar39;
  ushort uVar40;
  MixingHashState MVar41;
  ctrl_t *pcVar42;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  uint64_t v;
  ulong uVar46;
  undefined4 uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  __m128i match;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  FindInfo FVar52;
  ulong local_b0;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_&>_>
  local_68;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  undefined1 local_48 [16];
  
  size = key->_M_string_length;
  MVar41 = hash_internal::MixingHashState::combine_contiguous
                     ((MixingHashState)&hash_internal::MixingHashState::kSeed,
                      (uchar *)(key->_M_dataplus)._M_p,size);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = MVar41.state_ + size;
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar44 = SUB168(auVar48 * ZEXT816(0x9ddfea08eb382d69),8) ^
           SUB168(auVar48 * ZEXT816(0x9ddfea08eb382d69),0);
  uVar3 = *(ulong *)(this + 0x10);
  uVar46 = uVar44 >> 7 ^ uVar3 >> 0xc;
  auVar48 = ZEXT216(CONCAT11((char)uVar44,(char)uVar44) & 0x7f7f);
  auVar48 = pshuflw(auVar48,auVar48,0);
  uVar47 = auVar48._0_4_;
  auVar50._4_4_ = uVar47;
  auVar50._0_4_ = uVar47;
  auVar50._8_4_ = uVar47;
  auVar50._12_4_ = uVar47;
  local_b0 = 0;
  do {
    uVar46 = uVar46 & uVar2;
    pcVar1 = (char *)(uVar3 + uVar46);
    auVar49[0] = -(auVar50[0] == *pcVar1);
    auVar49[1] = -(auVar50[1] == pcVar1[1]);
    auVar49[2] = -(auVar50[2] == pcVar1[2]);
    auVar49[3] = -(auVar50[3] == pcVar1[3]);
    auVar49[4] = -(auVar50[4] == pcVar1[4]);
    auVar49[5] = -(auVar50[5] == pcVar1[5]);
    auVar49[6] = -(auVar50[6] == pcVar1[6]);
    auVar49[7] = -(auVar50[7] == pcVar1[7]);
    auVar49[8] = -(auVar50[8] == pcVar1[8]);
    auVar49[9] = -(auVar50[9] == pcVar1[9]);
    auVar49[10] = -(auVar50[10] == pcVar1[10]);
    auVar49[0xb] = -(auVar50[0xb] == pcVar1[0xb]);
    auVar49[0xc] = -(auVar50[0xc] == pcVar1[0xc]);
    auVar49[0xd] = -(auVar50[0xd] == pcVar1[0xd]);
    auVar49[0xe] = -(auVar50[0xe] == pcVar1[0xe]);
    auVar49[0xf] = -(auVar50[0xf] == pcVar1[0xf]);
    uVar40 = (ushort)(SUB161(auVar49 >> 7,0) & 1) | (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe | (ushort)(auVar49[0xf] >> 7) << 0xf;
    uVar43 = (uint)uVar40;
    cVar22 = *pcVar1;
    cVar23 = pcVar1[1];
    cVar24 = pcVar1[2];
    cVar25 = pcVar1[3];
    cVar26 = pcVar1[4];
    cVar27 = pcVar1[5];
    cVar28 = pcVar1[6];
    cVar29 = pcVar1[7];
    cVar30 = pcVar1[8];
    cVar31 = pcVar1[9];
    cVar32 = pcVar1[10];
    cVar33 = pcVar1[0xb];
    cVar34 = pcVar1[0xc];
    cVar35 = pcVar1[0xd];
    cVar36 = pcVar1[0xe];
    cVar37 = pcVar1[0xf];
    cVar39 = local_58;
    cVar7 = cStack_57;
    cVar8 = cStack_56;
    cVar9 = cStack_55;
    cVar10 = cStack_54;
    cVar11 = cStack_53;
    cVar12 = cStack_52;
    cVar13 = cStack_51;
    cVar14 = cStack_50;
    cVar15 = cStack_4f;
    cVar16 = cStack_4e;
    cVar17 = cStack_4d;
    cVar18 = cStack_4c;
    cVar19 = cStack_4b;
    cVar20 = cStack_4a;
    cVar21 = cStack_49;
    while (cStack_49 = cVar37, cStack_4a = cVar36, cStack_4b = cVar35, cStack_4c = cVar34,
          cStack_4d = cVar33, cStack_4e = cVar32, cStack_4f = cVar31, cStack_50 = cVar30,
          cStack_51 = cVar29, cStack_52 = cVar28, cStack_53 = cVar27, cStack_54 = cVar26,
          cStack_55 = cVar25, cStack_56 = cVar24, cStack_57 = cVar23, local_58 = cVar22, uVar40 != 0
          ) {
      uVar5 = 0;
      if (uVar43 != 0) {
        for (; (uVar43 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar45 = uVar5 + uVar46 & uVar2;
      local_68.first.
      super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .
      super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            )(*(long *)(this + 0x18) + uVar45 * 0x28);
      local_68.second.
      super__Tuple_impl<0UL,_const_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_&>
      .
      super__Head_base<0UL,_const_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_&,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_const_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_&>
            )(*(long *)(this + 0x18) + 0x20 + uVar45 * 0x28);
      local_78.rhs = key;
      local_78.eq = (key_equal *)this;
      local_48 = auVar50;
      bVar38 = memory_internal::
               DecomposePairImpl<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>>>>>::EqualElement<std::__cxx11::string>,std::__cxx11::string_const&,std::tuple<std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>>const&>>
                         (&local_78,&local_68);
      if (bVar38) {
        if (*(long *)(this + 0x10) == 0) goto LAB_002dbb9b;
        pcVar42 = (ctrl_t *)(*(long *)(this + 0x10) + uVar45);
        bVar38 = false;
        goto LAB_002dbb46;
      }
      uVar40 = (ushort)(uVar43 - 1) & (ushort)uVar43;
      uVar43 = CONCAT22((short)(uVar43 - 1 >> 0x10),uVar40);
      auVar50 = local_48;
      cVar22 = local_58;
      cVar23 = cStack_57;
      cVar24 = cStack_56;
      cVar25 = cStack_55;
      cVar26 = cStack_54;
      cVar27 = cStack_53;
      cVar28 = cStack_52;
      cVar29 = cStack_51;
      cVar30 = cStack_50;
      cVar31 = cStack_4f;
      cVar32 = cStack_4e;
      cVar33 = cStack_4d;
      cVar34 = cStack_4c;
      cVar35 = cStack_4b;
      cVar36 = cStack_4a;
      cVar37 = cStack_49;
      cVar39 = local_58;
      cVar7 = cStack_57;
      cVar8 = cStack_56;
      cVar9 = cStack_55;
      cVar10 = cStack_54;
      cVar11 = cStack_53;
      cVar12 = cStack_52;
      cVar13 = cStack_51;
      cVar14 = cStack_50;
      cVar15 = cStack_4f;
      cVar16 = cStack_4e;
      cVar17 = cStack_4d;
      cVar18 = cStack_4c;
      cVar19 = cStack_4b;
      cVar20 = cStack_4a;
      cVar21 = cStack_49;
    }
    auVar51[0] = -(local_58 == -0x80);
    auVar51[1] = -(cStack_57 == -0x80);
    auVar51[2] = -(cStack_56 == -0x80);
    auVar51[3] = -(cStack_55 == -0x80);
    auVar51[4] = -(cStack_54 == -0x80);
    auVar51[5] = -(cStack_53 == -0x80);
    auVar51[6] = -(cStack_52 == -0x80);
    auVar51[7] = -(cStack_51 == -0x80);
    auVar51[8] = -(cStack_50 == -0x80);
    auVar51[9] = -(cStack_4f == -0x80);
    auVar51[10] = -(cStack_4e == -0x80);
    auVar51[0xb] = -(cStack_4d == -0x80);
    auVar51[0xc] = -(cStack_4c == -0x80);
    auVar51[0xd] = -(cStack_4b == -0x80);
    auVar51[0xe] = -(cStack_4a == -0x80);
    auVar51[0xf] = -(cStack_49 == -0x80);
    uVar40 = (ushort)(SUB161(auVar51 >> 7,0) & 1) | (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe | (ushort)(auVar51[0xf] >> 7) << 0xf;
    local_58 = cVar39;
    cStack_57 = cVar7;
    cStack_56 = cVar8;
    cStack_55 = cVar9;
    cStack_54 = cVar10;
    cStack_53 = cVar11;
    cStack_52 = cVar12;
    cStack_51 = cVar13;
    cStack_50 = cVar14;
    cStack_4f = cVar15;
    cStack_4e = cVar16;
    cStack_4d = cVar17;
    cStack_4c = cVar18;
    cStack_4b = cVar19;
    cStack_4a = cVar20;
    cStack_49 = cVar21;
    if (uVar40 != 0) {
      cVar39 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                         (*(ulong *)this,uVar44,*(ctrl_t **)(this + 0x10));
      if (cVar39 == '\0') {
        uVar43 = 0;
        if (uVar40 != 0) {
          for (; (uVar40 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
          }
        }
      }
      else {
        uVar6 = 0xf;
        if (uVar40 != 0) {
          for (; uVar40 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar43 = (ushort)((uVar6 ^ 0xfff0) + 0x11) - 1;
      }
      FVar52.offset = uVar43 + uVar46 & uVar2;
      FVar52.probe_length = local_b0;
      uVar45 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                         ((CommonFields *)this,uVar44,FVar52,
                          (PolicyFunctions *)GetPolicyFunctions()::value);
      if (*(long *)(this + 0x10) == 0) {
LAB_002dbb9b:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9c4,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum>>>]"
                     );
      }
      pcVar42 = (ctrl_t *)(*(long *)(this + 0x10) + uVar45);
      bVar38 = true;
LAB_002dbb46:
      lVar4 = *(long *)(this + 0x18);
      (__return_storage_ptr__->first).ctrl_ = pcVar42;
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(uVar45 * 0x28 + lVar4);
      __return_storage_ptr__->second = bVar38;
      return __return_storage_ptr__;
    }
    uVar46 = uVar46 + local_b0 + 0x10;
    local_b0 = local_b0 + 0x10;
    if (*(ulong *)this < local_b0) {
      __assert_fail("seq.index() <= capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xef5,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum>>>, K = std::basic_string<char>]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }